

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

int array_getfields(t_symbol *elemtemplatesym,_glist **elemtemplatecanvasp,
                   t_template **elemtemplatep,int *elemsizep,_fielddesc *xfielddesc,
                   _fielddesc *yfielddesc,_fielddesc *wfielddesc,int *xonsetp,int *yonsetp,
                   int *wonsetp)

{
  int iVar1;
  _glist *local_78;
  _glist *elemtemplatecanvas;
  t_symbol *varname;
  t_symbol *dummy;
  t_template *elemtemplate;
  int type;
  int xonset;
  int wonset;
  int yonset;
  int elemsize;
  int arrayonset;
  _fielddesc *yfielddesc_local;
  _fielddesc *xfielddesc_local;
  int *elemsizep_local;
  t_template **elemtemplatep_local;
  _glist **elemtemplatecanvasp_local;
  t_symbol *elemtemplatesym_local;
  
  local_78 = (_glist *)0x0;
  _elemsize = yfielddesc;
  yfielddesc_local = xfielddesc;
  xfielddesc_local = (_fielddesc *)elemsizep;
  elemsizep_local = (int *)elemtemplatep;
  elemtemplatep_local = (t_template **)elemtemplatecanvasp;
  elemtemplatecanvasp_local = (_glist **)elemtemplatesym;
  dummy = (t_symbol *)template_findbyname(elemtemplatesym);
  if ((t_template *)dummy == (t_template *)0x0) {
    pd_error((void *)0x0,"plot: %s: no such template",*elemtemplatecanvasp_local);
    elemtemplatesym_local._4_4_ = -1;
  }
  else {
    if (((t_symbol *)elemtemplatecanvasp_local != &s_float) &&
       (local_78 = template_findcanvas((t_template *)dummy), local_78 == (_glist *)0x0)) {
      pd_error((void *)0x0,"plot: %s: no canvas for this template",*elemtemplatecanvasp_local);
      return -1;
    }
    wonset = *(int *)&dummy[1].s_name << 3;
    if ((_elemsize == (_fielddesc *)0x0) || (_elemsize->fd_var == '\0')) {
      elemtemplatecanvas = (_glist *)gensym("y");
    }
    else {
      elemtemplatecanvas = (_glist *)(_elemsize->fd_un).fd_symbol;
    }
    iVar1 = template_find_field((t_template *)dummy,(t_symbol *)elemtemplatecanvas,&xonset,
                                (int *)&elemtemplate,&varname);
    if ((iVar1 == 0) || ((int)elemtemplate != 0)) {
      xonset = -1;
    }
    if ((yfielddesc_local == (_fielddesc *)0x0) || (yfielddesc_local->fd_var == '\0')) {
      elemtemplatecanvas = (_glist *)gensym("x");
    }
    else {
      elemtemplatecanvas = (_glist *)(yfielddesc_local->fd_un).fd_symbol;
    }
    iVar1 = template_find_field((t_template *)dummy,(t_symbol *)elemtemplatecanvas,
                                (int *)((long)&elemtemplate + 4),(int *)&elemtemplate,&varname);
    if ((iVar1 == 0) || ((int)elemtemplate != 0)) {
      elemtemplate._4_4_ = -1;
    }
    if ((wfielddesc == (_fielddesc *)0x0) || (wfielddesc->fd_var == '\0')) {
      elemtemplatecanvas = (_glist *)gensym("w");
    }
    else {
      elemtemplatecanvas = (_glist *)(wfielddesc->fd_un).fd_symbol;
    }
    iVar1 = template_find_field((t_template *)dummy,(t_symbol *)elemtemplatecanvas,&type,
                                (int *)&elemtemplate,&varname);
    if ((iVar1 == 0) || ((int)elemtemplate != 0)) {
      type = -1;
    }
    *elemtemplatep_local = (t_template *)local_78;
    *(t_symbol **)elemsizep_local = dummy;
    xfielddesc_local->fd_type = (undefined1)wonset;
    xfielddesc_local->fd_var = wonset._1_1_;
    *(undefined2 *)&xfielddesc_local->field_0x2 = wonset._2_2_;
    *xonsetp = elemtemplate._4_4_;
    *yonsetp = xonset;
    *wonsetp = type;
    elemtemplatesym_local._4_4_ = 0;
  }
  return elemtemplatesym_local._4_4_;
}

Assistant:

int array_getfields(t_symbol *elemtemplatesym,
    t_canvas **elemtemplatecanvasp,
    t_template **elemtemplatep, int *elemsizep,
    t_fielddesc *xfielddesc, t_fielddesc *yfielddesc, t_fielddesc *wfielddesc,
    int *xonsetp, int *yonsetp, int *wonsetp)
{
    int arrayonset, elemsize, yonset, wonset, xonset, type;
    t_template *elemtemplate;
    t_symbol *dummy, *varname;
    t_canvas *elemtemplatecanvas = 0;

        /* the "float" template is special in not having to have a canvas;
        template_findbyname is hardwired to return a predefined
        template. */

    if (!(elemtemplate =  template_findbyname(elemtemplatesym)))
    {
        pd_error(0, "plot: %s: no such template", elemtemplatesym->s_name);
        return (-1);
    }
    if (!((elemtemplatesym == &s_float) ||
        (elemtemplatecanvas = template_findcanvas(elemtemplate))))
    {
        pd_error(0, "plot: %s: no canvas for this template", elemtemplatesym->s_name);
        return (-1);
    }
    elemsize = elemtemplate->t_n * sizeof(t_word);
    if (yfielddesc && yfielddesc->fd_var)
        varname = yfielddesc->fd_un.fd_varsym;
    else varname = gensym("y");
    if (!template_find_field(elemtemplate, varname, &yonset, &type, &dummy)
        || type != DT_FLOAT)
            yonset = -1;
    if (xfielddesc && xfielddesc->fd_var)
        varname = xfielddesc->fd_un.fd_varsym;
    else varname = gensym("x");
    if (!template_find_field(elemtemplate, varname, &xonset, &type, &dummy)
        || type != DT_FLOAT)
            xonset = -1;
    if (wfielddesc && wfielddesc->fd_var)
        varname = wfielddesc->fd_un.fd_varsym;
    else varname = gensym("w");
    if (!template_find_field(elemtemplate, varname, &wonset, &type, &dummy)
        || type != DT_FLOAT)
            wonset = -1;

        /* fill in slots for return values */
    *elemtemplatecanvasp = elemtemplatecanvas;
    *elemtemplatep = elemtemplate;
    *elemsizep = elemsize;
    *xonsetp = xonset;
    *yonsetp = yonset;
    *wonsetp = wonset;
    return (0);
}